

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVectorizerValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)602>(Result *__return_storage_ptr__,Model *format)

{
  bool bVar1;
  Type *pTVar2;
  int index;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  undefined1 *puVar3;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  allocator_type local_a1;
  _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_a0;
  undefined1 local_88 [40];
  Result result;
  TypeCase local_38 [4];
  
  puVar3 = (undefined1 *)format->description_;
  if ((ModelDescription *)puVar3 == (ModelDescription *)0x0) {
    puVar3 = Specification::_ModelDescription_default_instance_;
  }
  Result::Result(&result);
  local_a0._M_impl.super__Vector_impl_data._M_start._0_1_ = false;
  local_a0._M_impl.super__Vector_impl_data._M_start._1_1_ = false;
  local_a0._M_impl.super__Vector_impl_data._M_start._2_1_ = false;
  local_a0._M_impl.super__Vector_impl_data._M_start._3_1_ = false;
  validateModelDescription
            ((Result *)local_88,(ModelDescription *)puVar3,format->specificationversion_,
             (ValidationPolicy *)&local_a0);
  Result::operator=(&result,(Result *)local_88);
  std::__cxx11::string::~string((string *)(local_88 + 8));
  bVar1 = Result::good(&result);
  if (bVar1) {
    local_38[0] = kInt64Type;
    local_38[1] = kDoubleType;
    local_38[2] = kMultiArrayType;
    local_38[3] = kDictionaryType;
    __l._M_len = 4;
    __l._M_array = local_38;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)&local_a0,__l,&local_a1);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_88,(CoreML *)&((ModelDescription *)puVar3)->input_,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x0,(int)&local_a0,
               in_R8);
    Result::operator=(&result,(Result *)local_88);
    std::__cxx11::string::~string((string *)(local_88 + 8));
    std::
    _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~_Vector_base(&local_a0);
    bVar1 = Result::good(&result);
    if (bVar1) {
      local_38[0] = 5;
      __l_00._M_len = 1;
      __l_00._M_array = local_38;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)&local_a0,__l_00,&local_a1);
      validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)local_88,(CoreML *)&((ModelDescription *)puVar3)->output_,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_a0,
                 in_R8);
      Result::operator=(&result,(Result *)local_88);
      std::__cxx11::string::~string((string *)(local_88 + 8));
      std::
      _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::~_Vector_base(&local_a0);
      bVar1 = Result::good(&result);
      if (bVar1) {
        index = 0;
        do {
          puVar3 = Specification::_FeatureVectorizer_default_instance_;
          if (format->_oneof_case_[0] == 0x25a) {
            puVar3 = (undefined1 *)(format->Type_).supportvectorclassifier_;
          }
          if (*(int *)&(((SupportVectorClassifier *)puVar3)->numberofsupportvectorsperclass_).
                       arena_or_elements_ <= index) goto LAB_002688bd;
          pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureVectorizer_InputColumn>::TypeHandler>
                             ((RepeatedPtrFieldBase *)
                              &((SupportVectorClassifier *)puVar3)->numberofsupportvectorsperclass_,
                              index);
          index = index + 1;
        } while (pTVar2->inputdimensions_ != 0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_88,"Dimension size must be greater tha zero.",
                   (allocator<char> *)&local_a0);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_88);
        std::__cxx11::string::~string((string *)local_88);
        goto LAB_002688ca;
      }
    }
  }
LAB_002688bd:
  Result::Result(__return_storage_ptr__,&result);
LAB_002688ca:
  std::__cxx11::string::~string((string *)&result.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_featureVectorizer>(const Specification::Model& format) {
        const auto& interface = format.description();

        Result result;

            // Validate its a MLModel type.
        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }

            // Validate the inputs
        result = validateDescriptionsContainFeatureWithTypes(interface.input(),
                                                             0,
                                                             {Specification::FeatureType::kInt64Type,
                                                                 Specification::FeatureType::kDoubleType,
                                                                 Specification::FeatureType::kMultiArrayType,
                                                                 Specification::FeatureType::kDictionaryType});
        if (!result.good()) {
            return result;
        }

            // Validate the outputs
        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1, {Specification::FeatureType::kMultiArrayType});
        if (!result.good()) {
            return result;
        }

            // Validate the parameters
        for (int i = 0; i < format.featurevectorizer().inputlist_size(); i++) {
            auto& element = format.featurevectorizer().inputlist(i);
            auto size = element.inputdimensions();
            if (size <= 0) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Dimension size must be greater tha zero.");
            }
        }

        return result;
    }